

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall
llbuild::core::TaskInterface::spawn(TaskInterface *this,QueueJob *job,QueueJobPriority priority)

{
  long *plVar1;
  _Manager_type p_Var2;
  undefined4 in_register_00000014;
  JobDescriptor *local_38;
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type local_18;
  
  plVar1 = *(long **)((long)this->impl + 0xb8);
  local_38 = job->desc;
  local_30._M_unused._M_object = (void *)0x0;
  local_30._8_8_ = 0;
  local_20 = (_Manager_type)0x0;
  local_18 = (job->work)._M_invoker;
  p_Var2 = (job->work).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_30._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(job->work).super__Function_base._M_functor;
    local_30._8_8_ = *(undefined8 *)((long)&(job->work).super__Function_base._M_functor + 8);
    (job->work).super__Function_base._M_manager = (_Manager_type)0x0;
    (job->work)._M_invoker = (_Invoker_type)0x0;
    local_20 = p_Var2;
  }
  (**(code **)(*plVar1 + 0x10))(plVar1,&local_38,CONCAT44(in_register_00000014,priority));
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJob&& job, basic::QueueJobPriority priority) {
  // FIXME: handle environment
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().addJob(std::move(job), priority);
}